

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O2

wchar_t spell_collect_from_book(player *p,object *obj,int **spells)

{
  class_book_conflict *pcVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  pcVar1 = player_object_to_book(p,obj);
  if (pcVar1 == (class_book_conflict *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    uVar4 = (ulong)(uint)pcVar1->num_spells;
    if (pcVar1->num_spells < 1) {
      uVar4 = uVar5;
    }
    piVar2 = (int *)mem_zalloc(uVar4 * 8);
    *spells = piVar2;
    lVar3 = 8;
    for (; (long)uVar5 < (long)pcVar1->num_spells; uVar5 = uVar5 + 1) {
      piVar2[uVar5] = *(int *)((long)&pcVar1->spells->name + lVar3 * 4);
      lVar3 = lVar3 + 0xe;
    }
  }
  return (wchar_t)uVar4;
}

Assistant:

int spell_collect_from_book(const struct player *p, const struct object *obj,
		int **spells)
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	/* Count the spells */
	for (i = 0; i < book->num_spells; i++)
		n_spells++;

	/* Allocate the array */
	*spells = mem_zalloc(n_spells * sizeof(*spells));

	/* Write the spells */
	for (i = 0; i < book->num_spells; i++)
		(*spells)[i] = book->spells[i].sidx;

	return n_spells;
}